

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerMSL::add_msl_shader_output(CompilerMSL *this,MSLShaderInterfaceVariable *so)

{
  uint32_t uVar1;
  MSLShaderVariableFormat MVar2;
  BuiltIn BVar3;
  MSLShaderVariableRate MVar4;
  mapped_type *pmVar5;
  const_iterator cVar6;
  mapped_type *pmVar7;
  key_type local_18;
  
  local_18.location = so->location;
  local_18.component = so->component;
  pmVar5 = ::std::
           map<spirv_cross::LocationComponentPair,_spirv_cross::MSLShaderInterfaceVariable,_std::less<spirv_cross::LocationComponentPair>,_std::allocator<std::pair<const_spirv_cross::LocationComponentPair,_spirv_cross::MSLShaderInterfaceVariable>_>_>
           ::operator[](&this->outputs_by_location,&local_18);
  uVar1 = so->component;
  MVar2 = so->format;
  BVar3 = so->builtin;
  pmVar5->location = so->location;
  pmVar5->component = uVar1;
  pmVar5->format = MVar2;
  pmVar5->builtin = BVar3;
  MVar4 = so->rate;
  pmVar5->vecsize = so->vecsize;
  pmVar5->rate = MVar4;
  if (so->builtin != BuiltInMax) {
    local_18.location = so->builtin;
    cVar6 = ::std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->outputs_by_builtin)._M_h,&local_18.location);
    if (cVar6.
        super__Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_false>
        ._M_cur == (__node_type *)0x0) {
      local_18.location = so->builtin;
      pmVar7 = ::std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->outputs_by_builtin,&local_18.location);
      uVar1 = so->component;
      MVar2 = so->format;
      BVar3 = so->builtin;
      pmVar7->location = so->location;
      pmVar7->component = uVar1;
      pmVar7->format = MVar2;
      pmVar7->builtin = BVar3;
      MVar4 = so->rate;
      pmVar7->vecsize = so->vecsize;
      pmVar7->rate = MVar4;
    }
  }
  return;
}

Assistant:

void CompilerMSL::add_msl_shader_output(const MSLShaderInterfaceVariable &so)
{
	outputs_by_location[{so.location, so.component}] = so;
	if (so.builtin != BuiltInMax && !outputs_by_builtin.count(so.builtin))
		outputs_by_builtin[so.builtin] = so;
}